

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclComputeParametersClass(SC_Lib *p,SC_Cell *pRepr,float Slew,float *pLD,float *pPD)

{
  int iVar1;
  SC_Cell *pCell;
  float fVar2;
  float fVar3;
  float pd;
  float ld;
  float local_40;
  float local_3c;
  float *local_38;
  
  iVar1 = 0;
  local_40 = 0.0;
  local_3c = 0.0;
  fVar2 = 0.0;
  fVar3 = 0.0;
  pCell = pRepr;
  local_38 = pPD;
  do {
    Abc_SclComputeParametersCell(p,pCell,Slew,&local_3c,&local_40);
    fVar3 = fVar3 + local_3c;
    fVar2 = fVar2 + local_40;
    iVar1 = iVar1 + 1;
    pCell = pCell->pNext;
  } while (pCell != pRepr);
  *pLD = fVar3 / (float)iVar1;
  *local_38 = fVar2 / (float)iVar1;
  return;
}

Assistant:

void Abc_SclComputeParametersClass( SC_Lib * p, SC_Cell * pRepr, float Slew, float * pLD, float * pPD )
{
    SC_Cell * pCell;
    float LD, PD, ld, pd;
    int i, Count = 0;
    LD = PD = ld = pd = 0;
    SC_RingForEachCell( pRepr, pCell, i )
    {
        Abc_SclComputeParametersCell( p, pCell, Slew, &ld, &pd );
        LD += ld; PD += pd;
        Count++;
    }
    *pLD = LD / Abc_MaxInt(1, Count);
    *pPD = PD / Abc_MaxInt(1, Count);
}